

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O0

void __thiscall
fp::Algorithm::Navigate(Algorithm *this,array<int,_2UL> *current,array<int,_2UL> *next)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  reference pvVar9;
  element_type *peVar10;
  uint *puVar11;
  array<int,_2UL> local_3c;
  array<int,_2UL> node_next;
  array<int,_2UL> node_curr;
  char direction_togo;
  char curr_direction;
  int y;
  int x;
  array<int,_2UL> *next_local;
  array<int,_2UL> *current_local;
  Algorithm *this_local;
  
  node_curr._M_elems[0]._2_1_ = '\0';
  node_next = *(array<int,_2UL> *)current->_M_elems;
  local_3c = *(array<int,_2UL> *)next->_M_elems;
  pvVar9 = std::array<int,_2UL>::operator[](&local_3c,0);
  iVar1 = *pvVar9;
  pvVar9 = std::array<int,_2UL>::operator[](&node_next,0);
  iVar2 = *pvVar9;
  pvVar9 = std::array<int,_2UL>::operator[](&local_3c,1);
  iVar3 = *pvVar9;
  pvVar9 = std::array<int,_2UL>::operator[](&node_next,1);
  iVar4 = *pvVar9;
  peVar10 = std::__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->robot_);
  iVar8 = (**peVar10->_vptr_LandBasedRobot)();
  cVar6 = (char)iVar8;
  if ((iVar1 - iVar2 == -1) && (iVar3 == iVar4)) {
    node_curr._M_elems[0]._2_1_ = 'N';
  }
  else if ((iVar1 - iVar2 == 1) && (iVar3 == iVar4)) {
    node_curr._M_elems[0]._2_1_ = 'S';
  }
  else if ((iVar1 == iVar2) && (iVar3 - iVar4 == -1)) {
    node_curr._M_elems[0]._2_1_ = 'W';
  }
  else if ((iVar1 == iVar2) && (iVar3 - iVar4 == 1)) {
    node_curr._M_elems[0]._2_1_ = 'E';
  }
  if (cVar6 == 'N') {
    if (node_curr._M_elems[0]._2_1_ == 'N') {
      bVar7 = API::wallFront();
      if (bVar7) {
        this->path_blocked = true;
      }
      else {
        peVar10 = std::
                  __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->robot_);
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,0);
        uVar5 = *puVar11;
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,1);
        (*peVar10->_vptr_LandBasedRobot[1])(peVar10,(ulong)uVar5,(ulong)*puVar11,0x4e);
      }
    }
    else if (node_curr._M_elems[0]._2_1_ == 'S') {
      peVar10 = std::
                __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->robot_);
      (*peVar10->_vptr_LandBasedRobot[2])();
      peVar10 = std::
                __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->robot_);
      (*peVar10->_vptr_LandBasedRobot[2])();
      peVar10 = std::
                __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->robot_);
      puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,0);
      uVar5 = *puVar11;
      puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,1);
      (*peVar10->_vptr_LandBasedRobot[1])(peVar10,(ulong)uVar5,(ulong)*puVar11,0x53);
    }
    else if (node_curr._M_elems[0]._2_1_ == 'E') {
      bVar7 = API::wallRight();
      if (bVar7) {
        this->path_blocked = true;
      }
      else {
        peVar10 = std::
                  __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->robot_);
        (*peVar10->_vptr_LandBasedRobot[3])();
        peVar10 = std::
                  __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->robot_);
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,0);
        uVar5 = *puVar11;
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,1);
        (*peVar10->_vptr_LandBasedRobot[1])(peVar10,(ulong)uVar5,(ulong)*puVar11,0x45);
      }
    }
    else if (node_curr._M_elems[0]._2_1_ == 'W') {
      bVar7 = API::wallLeft();
      if (bVar7) {
        this->path_blocked = true;
      }
      else {
        peVar10 = std::
                  __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->robot_);
        (*peVar10->_vptr_LandBasedRobot[2])();
        peVar10 = std::
                  __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->robot_);
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,0);
        uVar5 = *puVar11;
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,1);
        (*peVar10->_vptr_LandBasedRobot[1])(peVar10,(ulong)uVar5,(ulong)*puVar11,0x57);
      }
    }
  }
  else if (cVar6 == 'S') {
    if (node_curr._M_elems[0]._2_1_ == 'N') {
      peVar10 = std::
                __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->robot_);
      (*peVar10->_vptr_LandBasedRobot[2])();
      peVar10 = std::
                __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->robot_);
      (*peVar10->_vptr_LandBasedRobot[2])();
      peVar10 = std::
                __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->robot_);
      puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,0);
      uVar5 = *puVar11;
      puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,1);
      (*peVar10->_vptr_LandBasedRobot[1])(peVar10,(ulong)uVar5,(ulong)*puVar11,0x4e);
    }
    else if (node_curr._M_elems[0]._2_1_ == 'S') {
      bVar7 = API::wallFront();
      if (bVar7) {
        this->path_blocked = true;
      }
      else {
        peVar10 = std::
                  __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->robot_);
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,0);
        uVar5 = *puVar11;
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,1);
        (*peVar10->_vptr_LandBasedRobot[1])(peVar10,(ulong)uVar5,(ulong)*puVar11,0x53);
      }
    }
    else if (node_curr._M_elems[0]._2_1_ == 'E') {
      bVar7 = API::wallLeft();
      if (bVar7) {
        this->path_blocked = true;
      }
      else {
        peVar10 = std::
                  __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->robot_);
        (*peVar10->_vptr_LandBasedRobot[2])();
        peVar10 = std::
                  __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->robot_);
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,0);
        uVar5 = *puVar11;
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,1);
        (*peVar10->_vptr_LandBasedRobot[1])(peVar10,(ulong)uVar5,(ulong)*puVar11,0x45);
      }
    }
    else if (node_curr._M_elems[0]._2_1_ == 'W') {
      bVar7 = API::wallRight();
      if (bVar7) {
        this->path_blocked = true;
      }
      else {
        peVar10 = std::
                  __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->robot_);
        (*peVar10->_vptr_LandBasedRobot[3])();
        peVar10 = std::
                  __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->robot_);
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,0);
        uVar5 = *puVar11;
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,1);
        (*peVar10->_vptr_LandBasedRobot[1])(peVar10,(ulong)uVar5,(ulong)*puVar11,0x57);
      }
    }
  }
  else if (cVar6 == 'E') {
    if (node_curr._M_elems[0]._2_1_ == 'N') {
      bVar7 = API::wallLeft();
      if (bVar7) {
        this->path_blocked = true;
      }
      else {
        peVar10 = std::
                  __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->robot_);
        (*peVar10->_vptr_LandBasedRobot[2])();
        peVar10 = std::
                  __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->robot_);
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,0);
        uVar5 = *puVar11;
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,1);
        (*peVar10->_vptr_LandBasedRobot[1])(peVar10,(ulong)uVar5,(ulong)*puVar11,0x4e);
      }
    }
    else if (node_curr._M_elems[0]._2_1_ == 'S') {
      bVar7 = API::wallRight();
      if (bVar7) {
        this->path_blocked = true;
      }
      else {
        peVar10 = std::
                  __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->robot_);
        (*peVar10->_vptr_LandBasedRobot[3])();
        peVar10 = std::
                  __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->robot_);
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,0);
        uVar5 = *puVar11;
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,1);
        (*peVar10->_vptr_LandBasedRobot[1])(peVar10,(ulong)uVar5,(ulong)*puVar11,0x53);
      }
    }
    else if (node_curr._M_elems[0]._2_1_ == 'E') {
      bVar7 = API::wallFront();
      if (bVar7) {
        this->path_blocked = true;
      }
      else {
        peVar10 = std::
                  __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->robot_);
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,0);
        uVar5 = *puVar11;
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,1);
        (*peVar10->_vptr_LandBasedRobot[1])(peVar10,(ulong)uVar5,(ulong)*puVar11,0x45);
      }
    }
    else if (node_curr._M_elems[0]._2_1_ == 'W') {
      peVar10 = std::
                __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->robot_);
      (*peVar10->_vptr_LandBasedRobot[2])();
      peVar10 = std::
                __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->robot_);
      (*peVar10->_vptr_LandBasedRobot[2])();
      peVar10 = std::
                __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->robot_);
      puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,0);
      uVar5 = *puVar11;
      puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,1);
      (*peVar10->_vptr_LandBasedRobot[1])(peVar10,(ulong)uVar5,(ulong)*puVar11,0x57);
    }
  }
  else if (cVar6 == 'W') {
    if (node_curr._M_elems[0]._2_1_ == 'N') {
      bVar7 = API::wallRight();
      if (bVar7) {
        this->path_blocked = true;
      }
      else {
        peVar10 = std::
                  __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->robot_);
        (*peVar10->_vptr_LandBasedRobot[3])();
        peVar10 = std::
                  __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->robot_);
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,0);
        uVar5 = *puVar11;
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,1);
        (*peVar10->_vptr_LandBasedRobot[1])(peVar10,(ulong)uVar5,(ulong)*puVar11,0x4e);
      }
    }
    else if (node_curr._M_elems[0]._2_1_ == 'S') {
      bVar7 = API::wallLeft();
      if (bVar7) {
        this->path_blocked = true;
      }
      else {
        peVar10 = std::
                  __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->robot_);
        (*peVar10->_vptr_LandBasedRobot[2])();
        peVar10 = std::
                  __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->robot_);
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,0);
        uVar5 = *puVar11;
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,1);
        (*peVar10->_vptr_LandBasedRobot[1])(peVar10,(ulong)uVar5,(ulong)*puVar11,0x53);
      }
    }
    else if (node_curr._M_elems[0]._2_1_ == 'E') {
      peVar10 = std::
                __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->robot_);
      (*peVar10->_vptr_LandBasedRobot[2])();
      peVar10 = std::
                __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->robot_);
      (*peVar10->_vptr_LandBasedRobot[2])();
      peVar10 = std::
                __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->robot_);
      puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,0);
      uVar5 = *puVar11;
      puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,1);
      (*peVar10->_vptr_LandBasedRobot[1])(peVar10,(ulong)uVar5,(ulong)*puVar11,0x45);
    }
    else if (node_curr._M_elems[0]._2_1_ == 'W') {
      bVar7 = API::wallFront();
      if (bVar7) {
        this->path_blocked = true;
      }
      else {
        peVar10 = std::
                  __shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->robot_);
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,0);
        uVar5 = *puVar11;
        puVar11 = (uint *)std::array<int,_2UL>::operator[](&local_3c,1);
        (*peVar10->_vptr_LandBasedRobot[1])(peVar10,(ulong)uVar5,(ulong)*puVar11,0x57);
      }
    }
  }
  return;
}

Assistant:

void fp::Algorithm::Navigate(std::array<int, 2> &current, std::array<int, 2> &next) {
    int x{}, y{};
    char curr_direction{};
    char direction_togo{};

    //---> Step 01: Extract the current Node and Next Node <---//
    std::array<int, 2> node_curr{current}, node_next{next};

    //---> Step 02: Compute the togo direction <---//
    x = node_next[0] - node_curr[0];
    y = node_next[1] - node_curr[1];
    curr_direction = this->robot_->GetDirection();

    if (x == -1 && y == 0) direction_togo = 'N';
    else if (x == 1 && y == 0) direction_togo = 'S';
    else if (x == 0 && y == -1) direction_togo = 'W';
    else if (x == 0 && y == 1) direction_togo = 'E';

    //---> Step 03: Navigate the Robot and update new location and direction info <---//
    if (curr_direction == 'N') {
        if (direction_togo == 'N') {
            if (!fp::API::wallFront()) this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            else this->path_blocked = true;
        } else if (direction_togo == 'S') {
            this->robot_->TurnLeft();
            this->robot_->TurnLeft();
            this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
        } else if (direction_togo == 'E') {
            if (!fp::API::wallRight()) {
                this->robot_->TurnRight();
                this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            } else this->path_blocked = true;
        } else if (direction_togo == 'W') {
            if (!fp::API::wallLeft()) {
                this->robot_->TurnLeft();
                this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            } else this->path_blocked = true;
        }
    } else if (curr_direction == 'S') {
        if (direction_togo == 'N') {
            this->robot_->TurnLeft();
            this->robot_->TurnLeft();
            this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
        } else if (direction_togo == 'S') {
            if (!fp::API::wallFront()) this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            else this->path_blocked = true;
        } else if (direction_togo == 'E') {
            if (!fp::API::wallLeft()) {
                this->robot_->TurnLeft();
                this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            } else this->path_blocked = true;
        } else if (direction_togo == 'W') {
            if (!fp::API::wallRight()) {
                this->robot_->TurnRight();
                this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            } else this->path_blocked = true;
        }
    } else if (curr_direction == 'E') {
        if (direction_togo == 'N') {
            if (!fp::API::wallLeft()) {
                this->robot_->TurnLeft();
                this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            } else this->path_blocked = true;
        } else if (direction_togo == 'S') {
            if (!fp::API::wallRight()) {
                this->robot_->TurnRight();
                this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            } else this->path_blocked = true;
        } else if (direction_togo == 'E') {
            if (!fp::API::wallFront()) this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            else this->path_blocked = true;
        } else if (direction_togo == 'W') {
            this->robot_->TurnLeft();
            this->robot_->TurnLeft();
            this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
        }
    } else if (curr_direction == 'W') {
        if (direction_togo == 'N') {
            if (!fp::API::wallRight()) {
                this->robot_->TurnRight();
                this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            } else this->path_blocked = true;
        } else if (direction_togo == 'S') {
            if (!fp::API::wallLeft()) {
                this->robot_->TurnLeft();
                this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            } else this->path_blocked = true;
        } else if (direction_togo == 'E') {
            this->robot_->TurnLeft();
            this->robot_->TurnLeft();
            this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
        } else if (direction_togo == 'W') {
            if (!fp::API::wallFront()) this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            else this->path_blocked = true;
        }
    }
}